

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O1

void swrenderer::R_EnterPortal(PortalDrawseg *pds,int depth)

{
  byte *pbVar1;
  double dVar2;
  double dVar3;
  short sVar4;
  short sVar5;
  int iVar6;
  line_t_conflict *src;
  vertex_t *pvVar7;
  line_t *plVar8;
  double dVar9;
  ushort uVar10;
  undefined8 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  DAngle DVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  int iVar22;
  ulong uVar23;
  DVector3 *pDVar24;
  uint uVar25;
  int iVar26;
  BYTE *pBVar27;
  long lVar28;
  long lVar29;
  bool bVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  timespec ts;
  timespec local_40;
  
  dVar21 = ViewPath[1].Z;
  dVar20 = ViewPath[1].Y;
  dVar19 = ViewPath[1].X;
  dVar18 = ViewPath[0].Z;
  dVar17 = ViewPath[0].Y;
  dVar16 = ViewPath[0].X;
  DVar15.Degrees = ViewAngle.Degrees;
  dVar14 = ViewPos.Z;
  dVar13 = ViewPos.Y;
  dVar12 = ViewPos.X;
  uVar25 = DAT_00730a5c;
  if (depth < r_portal_recursions.Value) {
    if (camera == (AActor *)0x0) {
      bVar30 = true;
    }
    else {
      bVar30 = ((camera->renderflags).Value & 0x8000) == 0;
    }
    CurrentPortalUniq = CurrentPortalUniq + 1;
    uVar23 = (ulong)DAT_00730a5c;
    src = (line_t_conflict *)pds->src;
    if (pds->mirror == true) {
      pvVar7 = src->v1;
      dVar2 = (src->delta).X;
      if (dVar2 == 0.0) {
        dVar3 = (pvVar7->p).X;
        pDVar24 = &ViewPos;
        dVar33 = ViewPos.X;
      }
      else {
        if ((src->delta).Y == 0.0) {
          dVar3 = (pvVar7->p).Y;
        }
        else {
          dVar33 = (pvVar7->p).X;
          dVar3 = (pvVar7->p).Y;
          dVar32 = (src->v2->p).X - dVar33;
          dVar31 = (src->v2->p).Y - dVar3;
          dVar9 = ((ViewPos.Y - dVar3) * dVar31 + (ViewPos.X - dVar33) * dVar32) /
                  (dVar31 * dVar31 + dVar32 * dVar32);
          dVar33 = dVar32 * dVar9 + dVar33;
          ViewPos.X = (dVar33 + dVar33) - ViewPos.X;
          dVar3 = dVar9 * dVar31 + dVar3;
        }
        pDVar24 = (DVector3 *)&ViewPos.Y;
        dVar33 = ViewPos.Y;
      }
      pDVar24->X = (dVar3 + dVar3) - dVar33;
      dVar2 = c_atan2((src->delta).Y,dVar2);
      ViewAngle.Degrees = dVar2 * 114.59155902616465 - DVar15.Degrees;
    }
    else {
      P_TranslatePortalXY(src,&ViewPos.X,&ViewPos.Y);
      P_TranslatePortalZ((line_t_conflict *)pds->src,&ViewPos.Z);
      P_TranslatePortalAngle((line_t_conflict *)pds->src,&ViewAngle);
      P_TranslatePortalXY((line_t_conflict *)pds->src,&ViewPath[0].X,&ViewPath[0].Y);
      P_TranslatePortalXY((line_t_conflict *)pds->src,&ViewPath[1].X,&ViewPath[1].Y);
      if ((((r_showviewer == false) && (camera != (AActor *)0x0)) &&
          (plVar8 = pds->dst, dVar2 = (plVar8->v1->p).X, dVar3 = (plVar8->v1->p).Y,
          dVar33 = (plVar8->delta).X, dVar9 = (plVar8->delta).Y,
          1.52587890625e-05 < (dVar2 - ViewPath[0].X) * dVar9 + (ViewPath[0].Y - dVar3) * dVar33 ==
          (dVar2 - ViewPath[1].X) * dVar9 + (ViewPath[1].Y - dVar3) * dVar33 <= 1.52587890625e-05))
         && (dVar2 = c_sqrt((ViewPath[0].Z - ViewPath[1].Z) * (ViewPath[0].Z - ViewPath[1].Z) +
                            (ViewPath[0].Y - ViewPath[1].Y) * (ViewPath[0].Y - ViewPath[1].Y) +
                            (ViewPath[0].X - ViewPath[1].X) * (ViewPath[0].X - ViewPath[1].X)),
            1.52587890625e-05 < dVar2)) {
        dVar3 = c_sqrt((ViewPos.Z - ViewPath[0].Z) * (ViewPos.Z - ViewPath[0].Z) +
                       (ViewPos.Y - ViewPath[0].Y) * (ViewPos.Y - ViewPath[0].Y) +
                       (ViewPos.X - ViewPath[0].X) * (ViewPos.X - ViewPath[0].X));
        dVar33 = c_sqrt((ViewPos.Z - ViewPath[1].Z) * (ViewPos.Z - ViewPath[1].Z) +
                        (ViewPos.Y - ViewPath[1].Y) * (ViewPos.Y - ViewPath[1].Y) +
                        (ViewPos.X - ViewPath[1].X) * (ViewPos.X - ViewPath[1].X));
        if (dVar33 + dVar3 < dVar2 + 1.0) {
          (camera->renderflags).Value = (camera->renderflags).Value | 0x8000;
        }
      }
    }
    ViewSin = FFastTrig::sin(&fasttrig,ViewAngle.Degrees * 11930464.711111112 + 6755399441055744.0);
    ViewCos = FFastTrig::cos(&fasttrig,ViewAngle.Degrees * 11930464.711111112 + 6755399441055744.0);
    uVar11 = CurrentPortal;
    ViewTanSin = ViewSin * FocalTangent;
    ViewTanCos = FocalTangent * ViewCos;
    DAT_01788570 = ViewPos.Z;
    stacked_viewpos = ViewPos.X;
    _DAT_01788568 = ViewPos.Y;
    stacked_angle = ViewAngle.Degrees;
    stacked_extralight = extralight;
    validcount = validcount + 1;
    stacked_visibility = CurrentVisibility;
    CurrentPortal = pds;
    R_ClearPlanes(false);
    R_ClearClipSegs((short)pds->x1,(short)pds->x2);
    uVar10 = _MirrorFlags;
    WindowLeft = pds->x1;
    WindowRight = pds->x2;
    if (pds->mirror == true) {
      _MirrorFlags = _MirrorFlags ^ 1;
    }
    R_3D_EnterSkybox();
    CurrentPortalInSkybox = 0;
    memcpy(&ceilingclip + pds->x1,(pds->ceilingclip).Array,(long)pds->len * 2);
    memcpy(&floorclip + pds->x1,(pds->floorclip).Array,(long)pds->len * 2);
    InSubsector = 0;
    R_RenderBSPNode(nodes + (long)numnodes + -1);
    R_3D_ResetClip();
    if ((bool)(bVar30 & camera != (AActor *)0x0)) {
      pbVar1 = (byte *)((long)&(camera->renderflags).Value + 1);
      *pbVar1 = *pbVar1 & 0x7f;
    }
    clock_gettime(1,&local_40);
    PlaneCycles.Sec =
         (double)local_40.tv_nsec * -1e-09 + (PlaneCycles.Sec - (double)local_40.tv_sec);
    R_DrawPlanes();
    R_DrawPortals();
    clock_gettime(1,&local_40);
    iVar22 = CurrentPortalUniq;
    PlaneCycles.Sec = (double)local_40.tv_sec + PlaneCycles.Sec + (double)local_40.tv_nsec * 1e-09;
    if (uVar25 < DAT_00730a5c) {
      lVar28 = uVar23 * 0x48;
      lVar29 = DAT_00730a5c - uVar23;
      do {
        R_EnterPortal((PortalDrawseg *)(WallPortals + lVar28),depth + 1);
        lVar28 = lVar28 + 0x48;
        lVar29 = lVar29 + -1;
      } while (lVar29 != 0);
    }
    iVar6 = CurrentPortalUniq;
    CurrentPortalUniq = iVar22;
    NetUpdate();
    clock_gettime(1,&local_40);
    MaskedCycles.Sec =
         (double)local_40.tv_nsec * -1e-09 + (MaskedCycles.Sec - (double)local_40.tv_sec);
    R_DrawMasked();
    clock_gettime(1,&local_40);
    MaskedCycles.Sec = (double)local_40.tv_sec + MaskedCycles.Sec + (double)local_40.tv_nsec * 1e-09
    ;
    NetUpdate();
    R_3D_LeaveSkybox();
    CurrentPortalUniq = iVar6;
    if (r_highlight_portals.Value == true) {
      R_HighlightPortal(pds);
    }
  }
  else {
    iVar22 = BestColor((uint32 *)&GPalette,0,0,0,0,0xff);
    uVar25 = pds->x1;
    if ((int)uVar25 < pds->x2) {
      iVar6 = RenderTarget->Pitch;
      do {
        if ((-1 < (int)uVar25) && ((int)uVar25 < RenderTarget->Width)) {
          lVar28 = (long)(int)uVar25 - (long)pds->x1;
          sVar4 = (pds->ceilingclip).Array[lVar28];
          sVar5 = (pds->floorclip).Array[lVar28];
          if (sVar4 <= sVar5) {
            pBVar27 = RenderTarget->Buffer + (long)(iVar6 * sVar4) + (ulong)uVar25;
            iVar26 = ((int)sVar5 - (int)sVar4) + 1;
            do {
              *pBVar27 = (BYTE)iVar22;
              pBVar27 = pBVar27 + iVar6;
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
          }
        }
        uVar25 = uVar25 + 1;
      } while ((int)uVar25 < pds->x2);
    }
    uVar10 = _MirrorFlags;
    uVar11 = CurrentPortal;
    dVar12 = ViewPos.X;
    dVar13 = ViewPos.Y;
    dVar14 = ViewPos.Z;
    DVar15.Degrees = ViewAngle.Degrees;
    dVar16 = ViewPath[0].X;
    dVar17 = ViewPath[0].Y;
    dVar18 = ViewPath[0].Z;
    dVar19 = ViewPath[1].X;
    dVar20 = ViewPath[1].Y;
    dVar21 = ViewPath[1].Z;
    if (r_highlight_portals.Value != false) {
      R_HighlightPortal(pds);
      return;
    }
  }
  ViewPath[1].Z = dVar21;
  ViewPath[1].Y = dVar20;
  ViewPath[1].X = dVar19;
  ViewPath[0].Z = dVar18;
  ViewPath[0].Y = dVar17;
  ViewPath[0].X = dVar16;
  ViewAngle.Degrees = DVar15.Degrees;
  ViewPos.Z = dVar14;
  ViewPos.Y = dVar13;
  ViewPos.X = dVar12;
  CurrentPortal = (PortalDrawseg *)uVar11;
  _MirrorFlags = uVar10;
  return;
}

Assistant:

void R_EnterPortal (PortalDrawseg* pds, int depth)
{
	// [ZZ] check depth. fill portal with black if it's exceeding the visual recursion limit, and continue like nothing happened.
	if (depth >= r_portal_recursions)
	{
		BYTE color = (BYTE)BestColor((DWORD *)GPalette.BaseColors, 0, 0, 0, 0, 255);
		int spacing = RenderTarget->GetPitch();
		for (int x = pds->x1; x < pds->x2; x++)
		{
			if (x < 0 || x >= RenderTarget->GetWidth())
				continue;

			int Ytop = pds->ceilingclip[x-pds->x1];
			int Ybottom = pds->floorclip[x-pds->x1];

			BYTE *dest = RenderTarget->GetBuffer() + x + Ytop * spacing;

			for (int y = Ytop; y <= Ybottom; y++)
			{
				*dest = color;
				dest += spacing;
			}
		}

		if (r_highlight_portals)
			R_HighlightPortal(pds);

		return;
	}

	DAngle startang = ViewAngle;
	DVector3 startpos = ViewPos;
	DVector3 savedpath[2] = { ViewPath[0], ViewPath[1] };
	ActorRenderFlags savedvisibility = camera? camera->renderflags & RF_INVISIBLE : ActorRenderFlags::FromInt(0);

	CurrentPortalUniq++;

	unsigned int portalsAtStart = WallPortals.Size ();

	if (pds->mirror)
	{
		//vertex_t *v1 = ds->curline->v1;
		vertex_t *v1 = pds->src->v1;

		// Reflect the current view behind the mirror.
		if (pds->src->Delta().X == 0)
		{ // vertical mirror
			ViewPos.X = v1->fX() - startpos.X + v1->fX();
		}
		else if (pds->src->Delta().Y == 0)
		{ // horizontal mirror
			ViewPos.Y = v1->fY() - startpos.Y + v1->fY();
		}
		else
		{ // any mirror
			vertex_t *v2 = pds->src->v2;

			double dx = v2->fX() - v1->fX();
			double dy = v2->fY() - v1->fY();
			double x1 = v1->fX();
			double y1 = v1->fY();
			double x = startpos.X;
			double y = startpos.Y;

			// the above two cases catch len == 0
			double r = ((x - x1)*dx + (y - y1)*dy) / (dx*dx + dy*dy);

			ViewPos.X = (x1 + r * dx)*2 - x;
			ViewPos.Y = (y1 + r * dy)*2 - y;
		}
		ViewAngle = pds->src->Delta().Angle() * 2 - startang;
	}
	else
	{
		P_TranslatePortalXY(pds->src, ViewPos.X, ViewPos.Y);
		P_TranslatePortalZ(pds->src, ViewPos.Z);
		P_TranslatePortalAngle(pds->src, ViewAngle);
		P_TranslatePortalXY(pds->src, ViewPath[0].X, ViewPath[0].Y);
		P_TranslatePortalXY(pds->src, ViewPath[1].X, ViewPath[1].Y);

		if (!r_showviewer && camera && P_PointOnLineSidePrecise(ViewPath[0], pds->dst) != P_PointOnLineSidePrecise(ViewPath[1], pds->dst))
		{
			double distp = (ViewPath[0] - ViewPath[1]).Length();
			if (distp > EQUAL_EPSILON)
			{
				double dist1 = (ViewPos - ViewPath[0]).Length();
				double dist2 = (ViewPos - ViewPath[1]).Length();

				if (dist1 + dist2 < distp + 1)
				{
					camera->renderflags |= RF_INVISIBLE;
				}
			}
		}
	}

	ViewSin = ViewAngle.Sin();
	ViewCos = ViewAngle.Cos();

	ViewTanSin = FocalTangent * ViewSin;
	ViewTanCos = FocalTangent * ViewCos;

	R_CopyStackedViewParameters();

	validcount++;
	PortalDrawseg* prevpds = CurrentPortal;
	CurrentPortal = pds;

	R_ClearPlanes (false);
	R_ClearClipSegs (pds->x1, pds->x2);

	WindowLeft = pds->x1;
	WindowRight = pds->x2;
	
	// RF_XFLIP should be removed before calling the root function
	int prevmf = MirrorFlags;
	if (pds->mirror)
	{
		if (MirrorFlags & RF_XFLIP)
			MirrorFlags &= ~RF_XFLIP;
		else MirrorFlags |= RF_XFLIP;
	}

	// some portals have height differences, account for this here
	R_3D_EnterSkybox(); // push 3D floor height map
	CurrentPortalInSkybox = false; // first portal in a skybox should set this variable to false for proper clipping in skyboxes.

	// first pass, set clipping
	memcpy (ceilingclip + pds->x1, &pds->ceilingclip[0], pds->len*sizeof(*ceilingclip));
	memcpy (floorclip + pds->x1, &pds->floorclip[0], pds->len*sizeof(*floorclip));

	InSubsector = NULL;
	R_RenderBSPNode (nodes + numnodes - 1);
	R_3D_ResetClip(); // reset clips (floor/ceiling)
	if (!savedvisibility && camera) camera->renderflags &= ~RF_INVISIBLE;

	PlaneCycles.Clock();
	R_DrawPlanes ();
	R_DrawPortals ();
	PlaneCycles.Unclock();

	double vzp = ViewPos.Z;

	int prevuniq = CurrentPortalUniq;
	// depth check is in another place right now
	unsigned int portalsAtEnd = WallPortals.Size ();
	for (; portalsAtStart < portalsAtEnd; portalsAtStart++)
	{
		R_EnterPortal (&WallPortals[portalsAtStart], depth + 1);
	}
	int prevuniq2 = CurrentPortalUniq;
	CurrentPortalUniq = prevuniq;

	NetUpdate();

	MaskedCycles.Clock(); // [ZZ] count sprites in portals/mirrors along with normal ones.
	R_DrawMasked ();	  //      this is required since with portals there often will be cases when more than 80% of the view is inside a portal.
	MaskedCycles.Unclock();

	NetUpdate();

	R_3D_LeaveSkybox(); // pop 3D floor height map
	CurrentPortalUniq = prevuniq2;

	// draw a red line around a portal if it's being highlighted
	if (r_highlight_portals)
		R_HighlightPortal(pds);

	CurrentPortal = prevpds;
	MirrorFlags = prevmf;
	ViewAngle = startang;
	ViewPos = startpos;
	ViewPath[0] = savedpath[0];
	ViewPath[1] = savedpath[1];
}